

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::
DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,uint key,Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *val)

{
  uint uVar1;
  size_t sVar2;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar3;
  bool bVar4;
  Entry *pEVar5;
  uint uVar6;
  uint uVar7;
  uint local_14;
  
  local_14 = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar5 = findEntryToInsert(this,&local_14);
  uVar7 = (uint)(pEVar5->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar4 = ((pEVar5->field_0)._infoData & 1U) != 0;
  if (bVar4 || uVar7 != uVar1) {
    if (uVar7 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar6 = (pEVar5->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar6 = uVar1 << 2;
    }
    (pEVar5->field_0)._infoData = uVar6;
    pEVar5->_key = local_14;
    sVar2 = (pEVar5->_val)._capacity;
    (pEVar5->_val)._capacity = val->_capacity;
    val->_capacity = sVar2;
    ppVar3 = (pEVar5->_val)._cursor;
    (pEVar5->_val)._cursor = val->_cursor;
    val->_cursor = ppVar3;
    ppVar3 = (pEVar5->_val)._end;
    (pEVar5->_val)._end = val->_end;
    val->_end = ppVar3;
    ppVar3 = (pEVar5->_val)._stack;
    (pEVar5->_val)._stack = val->_stack;
    val->_stack = ppVar3;
    this->_size = this->_size + 1;
  }
  return bVar4 || uVar7 != uVar1;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }